

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderMaxInvocationsTest::iterate(GeometryShaderMaxInvocationsTest *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char *description;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_image;
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long lVar5;
  
  initTest(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_30,(ulong)(this->m_texture_width * 0x24),&local_31);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x1680))(this->m_program_object_id_for_multiple_invocations_pass);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa85);
  (**(code **)(lVar5 + 0x1c0))(0x437f0000,0,0,0);
  (**(code **)(lVar5 + 0x188))(0x4000);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa8a);
  (**(code **)(lVar5 + 0x538))(0,0,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Call drawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa8d);
  (**(code **)(lVar5 + 0x1220))
            (0,0,this->m_texture_width,9,0x1908,0x1401,
             local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa92);
  bVar1 = verifyResultOfMultipleInvocationsPass
                    (this,local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar5 + 0x1680))(this->m_program_object_id_for_single_invocation_pass);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa99);
  (**(code **)(lVar5 + 0x1c0))(0x437f0000,0,0,0);
  (**(code **)(lVar5 + 0x188))(0x4000);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa9e);
  (**(code **)(lVar5 + 0x538))(0,0,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Call drawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xaa1);
  (**(code **)(lVar5 + 0x1220))
            (0,0,this->m_texture_width,9,0x1908,0x1401,
             local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xaa6);
  bVar2 = verifyResultOfSingleInvocationPass
                    (this,local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  description = "Fail";
  if (bVar1 && bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(!bVar1 || !bVar2),description);
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderMaxInvocationsTest::iterate()
{
	initTest();

	/* Variables used for image verification purposes */
	std::vector<unsigned char> result_image(m_texture_width * m_texture_height * m_texture_pixel_size);

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render with multiple GS invocations */
	gl.useProgram(m_program_object_id_for_multiple_invocations_pass);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	gl.clearColor(255 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Call drawArrays() failed");

	/* Extract image from FBO */
	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, &result_image[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* Run verification */
	bool result_of_multiple_invocations_pass = verifyResultOfMultipleInvocationsPass(&result_image[0]);

	/* Render with single GS invocations */
	gl.useProgram(m_program_object_id_for_single_invocation_pass);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	gl.clearColor(255 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Call drawArrays() failed");

	/* Extract image from FBO */
	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, &result_image[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* Run verification */
	bool result_of_single_invocation_pass = verifyResultOfSingleInvocationPass(&result_image[0]);

	/* Set test result */
	if (result_of_multiple_invocations_pass && result_of_single_invocation_pass)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}